

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O2

string * __thiscall
flatbuffers::(anonymous_namespace)::GenType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Type *type,bool underlying)

{
  BaseType t;
  char *__s;
  string *name;
  Namespace *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_18;
  
  t = *(BaseType *)this;
  if (t == BASE_TYPE_VECTOR) {
    local_30 = *(undefined4 *)(this + 4);
    local_18 = *(undefined2 *)(this + 0x18);
    local_2c = 0;
    local_28 = *(undefined8 *)(this + 8);
    uStack_20 = *(undefined8 *)(this + 0x10);
    GenType_abi_cxx11_(&local_50,(_anonymous_namespace_ *)&local_30,(Type *)0x0,SUB41(local_30,0));
    std::operator+(&local_70,"[",&local_50);
    std::operator+(__return_storage_ptr__,&local_70,"]");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    if (t == BASE_TYPE_STRUCT) {
      name = *(string **)(this + 8);
      this_00 = (Namespace *)name[5]._M_string_length;
    }
    else {
      name = *(string **)(this + 0x10);
      if (name == (string *)0x0 || (char)type != '\0') {
        __s = TypeName(t);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_70);
        return __return_storage_ptr__;
      }
      this_00 = (Namespace *)name[5]._M_string_length;
    }
    Namespace::GetFullyQualifiedName(__return_storage_ptr__,this_00,name,1000);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenType(const Type &type, bool underlying = false) {
  switch (type.base_type) {
    case BASE_TYPE_STRUCT:
      return type.struct_def->defined_namespace->GetFullyQualifiedName(
          type.struct_def->name);
    case BASE_TYPE_VECTOR: return "[" + GenType(type.VectorType()) + "]";
    default:
      if (type.enum_def && !underlying) {
        return type.enum_def->defined_namespace->GetFullyQualifiedName(
            type.enum_def->name);
      } else {
        return TypeName(type.base_type);
      }
  }
}